

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

fio_url_s * fio_url_parse(fio_url_s *__return_storage_ptr__,char *url,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  bool bVar14;
  
  memset(__return_storage_ptr__,0,0xc0);
  (__return_storage_ptr__->scheme).data = url;
  bVar14 = true;
  if (length == 0) {
LAB_00109cd3:
    sVar4 = 0;
    sVar6 = 0;
    sVar3 = 0;
    sVar7 = 0;
    sVar9 = 0;
  }
  else {
    pbVar1 = (byte *)(url + length);
    if (*url == '/') {
      sVar3 = 0;
      sVar6 = 0;
      sVar4 = 0;
      sVar5 = 0;
      pbVar12 = (byte *)url;
LAB_00109be7:
      for (sVar7 = 0; pbVar12 + sVar7 < pbVar1; sVar7 = sVar7 + 1) {
        bVar2 = pbVar12[sVar7];
        if ((bVar2 == 0x23) || (bVar2 == 0x3f)) {
          (__return_storage_ptr__->path).capa = 0;
          (__return_storage_ptr__->path).len = sVar7;
          (__return_storage_ptr__->path).data = (char *)pbVar12;
          pbVar11 = pbVar12 + sVar7 + 1;
          if (pbVar12[sVar7] != 0x23) goto LAB_00109f0e;
          sVar9 = 0;
          goto LAB_00109f49;
        }
      }
      (__return_storage_ptr__->path).capa = 0;
      (__return_storage_ptr__->path).len = sVar7;
      (__return_storage_ptr__->path).data = (char *)pbVar12;
      bVar14 = true;
      sVar9 = 0;
    }
    else {
      sVar3 = 0;
      while ((pbVar12 = (byte *)(url + sVar3), pbVar12 < pbVar1 &&
             ((0x1d < *pbVar12 - 0x23 || ((0x30801001U >> (*pbVar12 - 0x23 & 0x1f) & 1) == 0))))) {
        sVar3 = sVar3 + 1;
      }
      if (length == sVar3) {
        (__return_storage_ptr__->host).len = length;
        (__return_storage_ptr__->host).data = url;
        goto LAB_00109cd3;
      }
      bVar2 = *pbVar12;
      if (bVar2 == 0x23) {
        (__return_storage_ptr__->host).len = sVar3;
        (__return_storage_ptr__->host).data = url;
        pbVar11 = (byte *)(url + sVar3 + 1);
        sVar9 = 0;
        sVar7 = 0;
        sVar3 = 0;
        sVar6 = 0;
        sVar4 = 0;
        sVar5 = 0;
LAB_00109f49:
        (__return_storage_ptr__->target).capa = 0;
        bVar14 = (long)pbVar1 - (long)pbVar11 == 0;
        (__return_storage_ptr__->target).len = (long)pbVar1 - (long)pbVar11;
        (__return_storage_ptr__->target).data = (char *)pbVar11;
      }
      else {
        if (bVar2 == 0x2f) {
          (__return_storage_ptr__->host).len = sVar3;
          (__return_storage_ptr__->host).data = url;
          sVar3 = 0;
          sVar6 = 0;
          sVar4 = 0;
          sVar5 = 0;
          goto LAB_00109be7;
        }
        lVar8 = 0x28;
        lVar10 = 0x20;
        sVar4 = sVar3;
        if (bVar2 == 0x3a) {
          if (((pbVar1 < url + sVar3 + 2) || (url[sVar3 + 1] != '/')) || (url[sVar3 + 2] != 0x2f)) {
            sVar5 = 0;
LAB_00109de4:
            (__return_storage_ptr__->user).len = sVar4;
            (__return_storage_ptr__->user).data = url;
            url = (char *)(pbVar12 + 1);
            for (sVar3 = 0; pbVar12 = (byte *)url + sVar3, pbVar12 < pbVar1; sVar3 = sVar3 + 1) {
              if (*pbVar12 == 0x2f) {
                (__return_storage_ptr__->port).capa = 0;
                (__return_storage_ptr__->port).len = sVar3;
                (__return_storage_ptr__->port).data = url;
                sVar6 = (__return_storage_ptr__->user).len;
                (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
                (__return_storage_ptr__->host).len = sVar6;
                (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
                (__return_storage_ptr__->user).len = 0;
                pbVar12 = (byte *)url + sVar3;
                sVar6 = 0;
                sVar4 = 0;
                goto LAB_00109be7;
              }
              if (*pbVar12 == 0x40) {
                (__return_storage_ptr__->password).capa = 0;
                lVar8 = 0x40;
                lVar10 = 0x38;
                sVar6 = sVar3;
                goto LAB_00109e85;
              }
            }
            (__return_storage_ptr__->port).capa = 0;
            (__return_storage_ptr__->port).len = sVar3;
            (__return_storage_ptr__->port).data = url;
            sVar6 = (__return_storage_ptr__->user).len;
            (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
            (__return_storage_ptr__->host).len = sVar6;
            (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
            (__return_storage_ptr__->user).len = 0;
          }
          else {
            (__return_storage_ptr__->scheme).len = sVar3;
            url = url + sVar3 + 3;
            sVar5 = sVar3;
LAB_00109d43:
            for (sVar3 = 0; pbVar12 = (byte *)url + sVar3, pbVar12 < pbVar1; sVar3 = sVar3 + 1) {
              bVar2 = *pbVar12;
              if (bVar2 == 0x2f) {
                (__return_storage_ptr__->host).capa = 0;
                (__return_storage_ptr__->host).len = sVar3;
                (__return_storage_ptr__->host).data = url;
                pbVar12 = (byte *)url + sVar3;
                sVar3 = 0;
                sVar6 = 0;
                sVar4 = 0;
                goto LAB_00109be7;
              }
              sVar4 = sVar3;
              if (bVar2 == 0x3a) {
                (__return_storage_ptr__->user).capa = 0;
                pbVar12 = (byte *)url + sVar3;
                goto LAB_00109de4;
              }
              if (bVar2 == 0x40) {
                (__return_storage_ptr__->user).capa = 0;
                sVar6 = 0;
                goto LAB_00109e85;
              }
            }
            (__return_storage_ptr__->host).capa = 0;
            (__return_storage_ptr__->host).len = sVar3;
            (__return_storage_ptr__->host).data = url;
            sVar3 = 0;
          }
          sVar9 = 0;
          sVar7 = 0;
          bVar14 = true;
          sVar6 = 0;
          sVar4 = 0;
        }
        else if (bVar2 == 0x3f) {
          (__return_storage_ptr__->host).len = sVar3;
          (__return_storage_ptr__->host).data = url;
          pbVar11 = (byte *)(url + sVar3 + 1);
          sVar7 = 0;
          sVar3 = 0;
          sVar6 = 0;
          sVar4 = 0;
          sVar5 = 0;
LAB_00109f0e:
          for (sVar9 = 0; (pbVar11 + sVar9 < pbVar1 && (pbVar11[sVar9] != 0x23)); sVar9 = sVar9 + 1)
          {
          }
          (__return_storage_ptr__->query).capa = 0;
          (__return_storage_ptr__->query).len = sVar9;
          (__return_storage_ptr__->query).data = (char *)pbVar11;
          pbVar11 = pbVar11 + sVar9 + 1;
          bVar14 = true;
          if (pbVar11 < pbVar1) goto LAB_00109f49;
        }
        else {
          if (bVar2 != 0x40) {
            sVar5 = 0;
            url = (char *)pbVar12;
            goto LAB_00109d43;
          }
          sVar5 = 0;
          sVar6 = 0;
LAB_00109e85:
          *(size_t *)((long)&(__return_storage_ptr__->scheme).capa + lVar10) = sVar3;
          *(char **)((long)&(__return_storage_ptr__->scheme).capa + lVar8) = url;
          sVar3 = 0;
          pbVar11 = pbVar12 + 1;
          for (pbVar12 = pbVar11; pbVar12 < pbVar1; pbVar12 = pbVar12 + 1) {
            if (((ulong)*pbVar12 < 0x40) &&
               ((0x8400800800000000U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)) {
              (__return_storage_ptr__->host).capa = 0;
              (__return_storage_ptr__->host).len = sVar3;
              (__return_storage_ptr__->host).data = (char *)pbVar11;
              bVar2 = *pbVar12;
              if (bVar2 == 0x23) {
                pbVar11 = pbVar12 + 1;
                sVar9 = 0;
                sVar7 = 0;
                sVar3 = 0;
                goto LAB_00109f49;
              }
              if (bVar2 == 0x3f) {
                pbVar11 = pbVar12 + 1;
                sVar7 = 0;
                sVar3 = 0;
                goto LAB_00109f0e;
              }
              if (bVar2 != 0x2f) {
                pbVar11 = pbVar12 + 2;
                pbVar13 = pbVar12 + 1;
                sVar3 = 0;
                pbVar12 = pbVar13;
                goto LAB_00109ff8;
              }
              sVar3 = 0;
              goto LAB_00109be7;
            }
            sVar3 = sVar3 + 1;
          }
          (__return_storage_ptr__->host).capa = 0;
          (__return_storage_ptr__->host).len = sVar3;
          (__return_storage_ptr__->host).data = (char *)pbVar11;
          bVar14 = true;
          sVar9 = 0;
          sVar7 = 0;
          sVar3 = 0;
        }
      }
    }
LAB_00109f66:
    if (sVar5 != 0) goto LAB_00109f70;
  }
  (__return_storage_ptr__->scheme).data = (char *)0x0;
LAB_00109f70:
  if (sVar4 == 0) {
    (__return_storage_ptr__->user).data = (char *)0x0;
  }
  if (sVar6 == 0) {
    (__return_storage_ptr__->password).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->host).len == 0) {
    (__return_storage_ptr__->host).data = (char *)0x0;
  }
  if (sVar3 == 0) {
    (__return_storage_ptr__->port).data = (char *)0x0;
  }
  if (sVar7 == 0) {
    (__return_storage_ptr__->path).data = (char *)0x0;
  }
  if (sVar9 == 0) {
    (__return_storage_ptr__->query).data = (char *)0x0;
  }
  if (bVar14) {
    (__return_storage_ptr__->target).data = (char *)0x0;
  }
  return __return_storage_ptr__;
LAB_00109ff8:
  if (pbVar1 <= pbVar12) goto LAB_0010a044;
  if (((ulong)*pbVar12 < 0x40) && ((0x8000800800000000U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)) {
    (__return_storage_ptr__->port).capa = 0;
    (__return_storage_ptr__->port).len = sVar3;
    (__return_storage_ptr__->port).data = (char *)pbVar13;
    if (*pbVar12 == 0x23) {
      sVar9 = 0;
      sVar7 = 0;
      goto LAB_00109f49;
    }
    if (*pbVar12 != 0x3f) goto LAB_00109be7;
    sVar7 = 0;
    goto LAB_00109f0e;
  }
  pbVar12 = pbVar12 + 1;
  sVar3 = sVar3 + 1;
  pbVar11 = pbVar11 + 1;
  goto LAB_00109ff8;
LAB_0010a044:
  (__return_storage_ptr__->port).capa = 0;
  (__return_storage_ptr__->port).len = sVar3;
  (__return_storage_ptr__->port).data = (char *)pbVar13;
  bVar14 = true;
  sVar9 = 0;
  sVar7 = 0;
  goto LAB_00109f66;
}

Assistant:

fio_url_s fio_url_parse(const char *url, size_t length) {
  /*
  Intention:
  [schema://][user[:]][password[@]][host.com[:/]][:port/][/path][?quary][#target]
  */
  const char *end = url + length;
  const char *pos = url;
  fio_url_s r = {.scheme = {.data = (char *)url}};
  if (length == 0) {
    goto finish;
  }

  if (pos[0] == '/') {
    /* start at path */
    goto start_path;
  }

  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@' &&
         pos[0] != '#' && pos[0] != '?')
    ++pos;

  if (pos == end) {
    /* was only host (path starts with '/') */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }
  switch (pos[0]) {
  case '@':
    /* username@[host] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case '/':
    /* host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '?':
    /* host?[query] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_query;
  case '#':
    /* host#[target] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_target;
  case ':':
    if (pos + 2 <= end && pos[1] == '/' && pos[2] == '/') {
      /* scheme:// */
      r.scheme.len = pos - url;
      pos += 3;
    } else {
      /* username:[password] OR */
      /* host:[port] */
      r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
      ++pos;
      goto start_password;
    }
    break;
  }

  // start_username:
  url = pos;
  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@'
         /* && pos[0] != '#' && pos[0] != '?' */)
    ++pos;

  if (pos >= end) { /* scheme://host */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }

  switch (pos[0]) {
  case '/':
    /* scheme://host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '@':
    /* scheme://username@[host]... */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case ':':
    /* scheme://username:[password]@[host]... OR */
    /* scheme://host:[port][/...] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_password:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '@')
    ++pos;

  if (pos >= end) {
    /* was host:port */
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto finish;
    ;
  }

  switch (pos[0]) {
  case '/':
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto start_path;
  case '@':
    r.password = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_host:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != ':' && pos[0] != '#' &&
         pos[0] != '?')
    ++pos;

  r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  if (pos >= end) {
    goto finish;
  }
  switch (pos[0]) {
  case '/':
    /* scheme://[...@]host[/path] */
    goto start_path;
  case '?':
    /* scheme://[...@]host?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host#[target] (bad)*/
    ++pos;
    goto start_target;
    // case ':':
    /* scheme://[...@]host:[port] */
  }
  ++pos;

  // start_port:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    /* scheme://[...@]host:port */
    goto finish;
  }
  switch (pos[0]) {
  case '?':
    /* scheme://[...@]host:port?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host:port#[target] (bad)*/
    ++pos;
    goto start_target;
    // case '/':
    /* scheme://[...@]host:port[/path] */
  }

start_path:
  url = pos;
  while (pos < end && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.path = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    goto finish;
  }
  ++pos;
  if (pos[-1] == '#')
    goto start_target;

start_query:
  url = pos;
  while (pos < end && pos[0] != '#')
    ++pos;

  r.query = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  ++pos;

  if (pos >= end)
    goto finish;

start_target:
  r.target = (fio_str_info_s){.data = (char *)pos, .len = end - pos};

finish:

  /* set any empty values to NULL */
  if (!r.scheme.len)
    r.scheme.data = NULL;
  if (!r.user.len)
    r.user.data = NULL;
  if (!r.password.len)
    r.password.data = NULL;
  if (!r.host.len)
    r.host.data = NULL;
  if (!r.port.len)
    r.port.data = NULL;
  if (!r.path.len)
    r.path.data = NULL;
  if (!r.query.len)
    r.query.data = NULL;
  if (!r.target.len)
    r.target.data = NULL;

  return r;
}